

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIShortDecoder::~FIShortDecoder(FIShortDecoder *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int16_t> value;
        size_t numShorts = len / 2;
        value.reserve(numShorts);
        for (size_t i = 0; i < numShorts; ++i) {
            int16_t v = (data[0] << 8) | data[1];
            value.push_back(v);
            data += 2;
        }
        return FIShortValue::create(std::move(value));
    }